

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.c
# Opt level: O0

int cmd_feature(char *arg)

{
  FILE *__stream;
  int iVar1;
  char *pcVar2;
  int *piVar3;
  size_t sVar4;
  void *rlcd;
  lys_module *module;
  uint8_t *states;
  char **names;
  char *feat_names;
  char *revision;
  char *model_name;
  char *ptr;
  char **argv;
  int local_28;
  uint max_len;
  int task;
  int ret;
  int option_index;
  int argc;
  int i;
  int c;
  char *arg_local;
  
  max_len = 1;
  local_28 = 0;
  ptr = (char *)0x0;
  names = (char **)0x0;
  ret = 1;
  _i = arg;
  ptr = (char *)malloc(0x10);
  pcVar2 = strdup(_i);
  *(char **)ptr = pcVar2;
  model_name = strtok(*(char **)ptr," ");
  while (model_name = strtok((char *)0x0," "), model_name != (char *)0x0) {
    pcVar2 = (char *)realloc(ptr,(long)(ret + 2) << 3);
    __stream = _stderr;
    if (pcVar2 == (char *)0x0) {
      piVar3 = __errno_location();
      pcVar2 = strerror(*piVar3);
      fprintf(__stream,"Memory allocation failed (%s:%d, %s)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/tools/lint/commands.c"
              ,0x4a5,pcVar2);
      goto LAB_0010a885;
    }
    *(char **)(pcVar2 + (long)ret * 8) = model_name;
    ptr = pcVar2;
    ret = ret + 1;
  }
  pcVar2 = ptr + (long)ret * 8;
  pcVar2[0] = '\0';
  pcVar2[1] = '\0';
  pcVar2[2] = '\0';
  pcVar2[3] = '\0';
  pcVar2[4] = '\0';
  pcVar2[5] = '\0';
  pcVar2[6] = '\0';
  pcVar2[7] = '\0';
  _optind = 0;
  do {
    while( true ) {
      while( true ) {
        task = 0;
        argc = getopt_long(ret,ptr,"he:d:",cmd_feature::long_options,&task);
        if (argc == -1) {
          if (_optind == ret) {
            fprintf(_stderr,"Missing the module name.\n");
          }
          else {
            feat_names = (char *)0x0;
            revision = *(char **)(ptr + (long)_optind * 8);
            pcVar2 = strchr(revision,0x40);
            if (pcVar2 != (char *)0x0) {
              pcVar2 = strchr(revision,0x40);
              *pcVar2 = '\0';
              feat_names = pcVar2 + 1;
            }
            rlcd = (void *)ly_ctx_get_module(ctx,revision,feat_names,0);
            if (rlcd == (void *)0x0) {
              rlcd = (void *)ly_ctx_get_submodule(ctx,0,0,revision,feat_names);
            }
            if (rlcd == (void *)0x0) {
              if (feat_names == (char *)0x0) {
                fprintf(_stderr,"No (sub)module \"%s\" found.\n",revision);
              }
              else {
                fprintf(_stderr,"No (sub)module \"%s\" in revision %s found.\n",revision,feat_names)
                ;
              }
            }
            else if (local_28 == 0) {
              printf("%s features:\n",*(undefined8 *)((long)rlcd + 8));
              states = (uint8_t *)lys_features_list(rlcd,&module);
              argv._4_4_ = 0;
              option_index = 0;
              while (*(long *)(states + (long)option_index * 8) != 0) {
                sVar4 = strlen(*(char **)(states + (long)option_index * 8));
                if (argv._4_4_ < sVar4) {
                  sVar4 = strlen(*(char **)(states + (long)option_index * 8));
                  argv._4_4_ = (uint)sVar4;
                }
                option_index = option_index + 1;
              }
              option_index = 0;
              while (*(long *)(states + (long)option_index * 8) != 0) {
                pcVar2 = "off";
                if (module->padding2[(long)option_index + -0x42] != '\0') {
                  pcVar2 = "on";
                }
                printf("\t%-*s (%s)\n",(ulong)argv._4_4_,
                       *(undefined8 *)(states + (long)option_index * 8),pcVar2);
                option_index = option_index + 1;
              }
              free(states);
              free(module);
              if (option_index == 0) {
                printf("\t(none)\n");
              }
            }
            else {
              names = (char **)strtok((char *)names,",");
              while (names != (char **)0x0) {
                if (((local_28 == 1) && (iVar1 = lys_features_enable(rlcd,names), iVar1 != 0)) ||
                   ((local_28 == 2 && (iVar1 = lys_features_disable(rlcd,names), iVar1 != 0)))) {
                  fprintf(_stderr,"Feature \"%s\" not found.\n",names);
                  max_len = 1;
                }
                names = (char **)strtok((char *)0x0,",");
              }
            }
          }
          goto LAB_0010a885;
        }
        if (argc == 0x3f) {
          fprintf(_stderr,"Unknown option \"%d\".\n",0x3f);
          goto LAB_0010a885;
        }
        if (argc != 100) break;
        if (local_28 != 0) {
          fprintf(_stderr,"Only one of enable, or disable can be specified.\n");
          goto LAB_0010a885;
        }
        local_28 = 2;
        names = _optarg;
      }
      if (argc != 0x65) break;
      if (local_28 != 0) {
        fprintf(_stderr,"Only one of enable or disable can be specified.\n");
        goto LAB_0010a885;
      }
      local_28 = 1;
      names = _optarg;
    }
  } while (argc != 0x68);
  cmd_feature_help();
  max_len = 0;
LAB_0010a885:
  free(*(void **)ptr);
  free(ptr);
  return max_len;
}

Assistant:

int
cmd_feature(const char *arg)
{
    int c, i, argc, option_index, ret = 1, task = 0;
    unsigned int max_len;
    char **argv = NULL, *ptr, *model_name, *revision, *feat_names = NULL;
    const char **names;
    uint8_t *states;
    const struct lys_module *module;
    static struct option long_options[] = {
        {"help", no_argument, 0, 'h'},
        {"enable", required_argument, 0, 'e'},
        {"disable", required_argument, 0, 'd'},
        {NULL, 0, 0, 0}
    };
    void *rlcd;

    argc = 1;
    argv = malloc(2*sizeof *argv);
    *argv = strdup(arg);
    ptr = strtok(*argv, " ");
    while ((ptr = strtok(NULL, " "))) {
        rlcd = realloc(argv, (argc + 2) * sizeof *argv);
        if (!rlcd) {
            fprintf(stderr, "Memory allocation failed (%s:%d, %s)", __FILE__, __LINE__, strerror(errno));
            goto cleanup;
        }
        argv = rlcd;
        argv[argc++] = ptr;
    }
    argv[argc] = NULL;

    optind = 0;
    while (1) {
        option_index = 0;
        c = getopt_long(argc, argv, "he:d:", long_options, &option_index);
        if (c == -1) {
            break;
        }

        switch (c) {
        case 'h':
            cmd_feature_help();
            ret = 0;
            goto cleanup;
        case 'e':
            if (task) {
                fprintf(stderr, "Only one of enable or disable can be specified.\n");
                goto cleanup;
            }
            task = 1;
            feat_names = optarg;
            break;
        case 'd':
            if (task) {
                fprintf(stderr, "Only one of enable, or disable can be specified.\n");
                goto cleanup;
            }
            task = 2;
            feat_names = optarg;
            break;
        case '?':
            fprintf(stderr, "Unknown option \"%d\".\n", (char)c);
            goto cleanup;
        }
    }

    /* module name */
    if (optind == argc) {
        fprintf(stderr, "Missing the module name.\n");
        goto cleanup;
    }

    revision = NULL;
    model_name = argv[optind];
    if (strchr(model_name, '@')) {
        revision = strchr(model_name, '@');
        revision[0] = '\0';
        ++revision;
    }

    module = ly_ctx_get_module(ctx, model_name, revision, 0);
    if (!module) {
        /* not a module, try to find it as a submodule */
        module = (const struct lys_module *)ly_ctx_get_submodule(ctx, NULL, NULL, model_name, revision);
    }

    if (module == NULL) {
        if (revision) {
            fprintf(stderr, "No (sub)module \"%s\" in revision %s found.\n", model_name, revision);
        } else {
            fprintf(stderr, "No (sub)module \"%s\" found.\n", model_name);
        }
        goto cleanup;
    }

    if (!task) {
        printf("%s features:\n", module->name);

        names = lys_features_list(module, &states);

        /* get the max len */
        max_len = 0;
        for (i = 0; names[i]; ++i) {
            if (strlen(names[i]) > max_len) {
                max_len = strlen(names[i]);
            }
        }
        for (i = 0; names[i]; ++i) {
            printf("\t%-*s (%s)\n", max_len, names[i], states[i] ? "on" : "off");
        }
        free(names);
        free(states);
        if (!i) {
            printf("\t(none)\n");
        }
    } else {
        feat_names = strtok(feat_names, ",");
        while (feat_names) {
            if (((task == 1) && lys_features_enable(module, feat_names))
                    || ((task == 2) && lys_features_disable(module, feat_names))) {
                fprintf(stderr, "Feature \"%s\" not found.\n", feat_names);
                ret = 1;
            }
            feat_names = strtok(NULL, ",");
        }
    }

cleanup:
    free(*argv);
    free(argv);

    return ret;
}